

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cpp
# Opt level: O2

uint32_t crc32c_append_sw(uint32_t crci,buffer input,size_t length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  buffer next;
  ulong uVar4;
  uint *puVar5;
  
  uVar3 = ~crci;
  puVar5 = (uint *)input;
  for (; (length != 0 && (((ulong)input & 3) != 0)); input = input + 1) {
    uVar2 = *puVar5;
    puVar5 = (uint *)((long)puVar5 + 1);
    uVar3 = uVar3 >> 8 ^ table[0][(byte)((byte)uVar2 ^ (byte)uVar3)];
    length = length - 1;
  }
  for (; 0xb < length; length = length - 0xc) {
    uVar3 = uVar3 ^ *puVar5;
    uVar2 = puVar5[1];
    uVar1 = puVar5[2];
    uVar3 = table[10][uVar3 >> 8 & 0xff] ^ table[0xb][uVar3 & 0xff] ^
            *(uint *)((long)table[9] + (ulong)(uVar3 >> 0xe & 0x3fc)) ^ table[8][uVar3 >> 0x18] ^
            table[7][uVar2 & 0xff] ^ table[6][uVar2 >> 8 & 0xff] ^
            *(uint *)((long)table[5] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^ table[4][uVar2 >> 0x18] ^
            table[3][uVar1 & 0xff] ^ table[2][uVar1 >> 8 & 0xff] ^
            *(uint *)((long)table[1] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^ table[0][uVar1 >> 0x18];
    puVar5 = puVar5 + 3;
  }
  for (uVar4 = 0; length != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = uVar3 >> 8 ^ table[0][(byte)(*(byte *)((long)puVar5 + uVar4) ^ (byte)uVar3)];
  }
  return ~uVar3;
}

Assistant:

uint32_t crc32c_append_sw(uint32_t crci, buffer input, size_t length)
{
    buffer next = input;
    uint32_t crc;

    crc = crci ^ 0xffffffff;
    while (length && ((uintptr_t)next & 3) != 0)
    {
        crc = table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
        --length;
    }
    while (length >= 12)
    {
        crc ^= *(uint32_t *)next;
        uint32_t high = *(uint32_t *)(next + 4);
        uint32_t high2 = *(uint32_t *)(next + 8);
        crc = table[11][crc & 0xff]
            ^ table[10][(crc >> 8) & 0xff]
            ^ table[9][(crc >> 16) & 0xff]
            ^ table[8][crc >> 24]
            ^ table[7][high & 0xff]
            ^ table[6][(high >> 8) & 0xff]
            ^ table[5][(high >> 16) & 0xff]
            ^ table[4][high >> 24]
            ^ table[3][high2 & 0xff]
            ^ table[2][(high2 >> 8) & 0xff]
            ^ table[1][(high2 >> 16) & 0xff]
            ^ table[0][high2 >> 24];
        next += 12;
        length -= 12;
    }
    while (length)
    {
        crc = table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
        --length;
    }
    return (uint32_t)crc ^ 0xffffffff;
}